

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

VkResult vkb::create_debug_utils_messenger
                   (VkInstance instance,PFN_vkDebugUtilsMessengerCallbackEXT debug_callback,
                   VkDebugUtilsMessageSeverityFlagsEXT severity,VkDebugUtilsMessageTypeFlagsEXT type
                   ,void *user_data_pointer,VkDebugUtilsMessengerEXT *pDebugMessenger,
                   VkAllocationCallbacks *allocation_callbacks)

{
  VkResult VVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  ulong uStack_20;
  PFN_vkDebugUtilsMessengerCallbackEXT local_18;
  void *pvStack_10;
  
  local_18 = default_debug_callback;
  if (debug_callback != (PFN_vkDebugUtilsMessengerCallbackEXT)0x0) {
    local_18 = debug_callback;
  }
  local_38 = 0x3b9cbe04;
  uStack_30 = 0;
  local_28 = (ulong)severity << 0x20;
  uStack_20 = (ulong)type;
  if (detail::vulkan_functions()::v._104_8_ == 0) {
    VVar1 = VK_ERROR_EXTENSION_NOT_PRESENT;
  }
  else {
    pvStack_10 = user_data_pointer;
    VVar1 = (*(code *)detail::vulkan_functions()::v._104_8_)
                      (instance,&local_38,allocation_callbacks,pDebugMessenger);
  }
  return VVar1;
}

Assistant:

VkResult create_debug_utils_messenger(VkInstance instance,
    PFN_vkDebugUtilsMessengerCallbackEXT debug_callback,
    VkDebugUtilsMessageSeverityFlagsEXT severity,
    VkDebugUtilsMessageTypeFlagsEXT type,
    void* user_data_pointer,
    VkDebugUtilsMessengerEXT* pDebugMessenger,
    VkAllocationCallbacks* allocation_callbacks) {

    if (debug_callback == nullptr) debug_callback = default_debug_callback;
    VkDebugUtilsMessengerCreateInfoEXT messengerCreateInfo = {};
    messengerCreateInfo.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
    messengerCreateInfo.pNext = nullptr;
    messengerCreateInfo.messageSeverity = severity;
    messengerCreateInfo.messageType = type;
    messengerCreateInfo.pfnUserCallback = debug_callback;
    messengerCreateInfo.pUserData = user_data_pointer;

    if (detail::vulkan_functions().fp_vkCreateDebugUtilsMessengerEXT != nullptr) {
        return detail::vulkan_functions().fp_vkCreateDebugUtilsMessengerEXT(
            instance, &messengerCreateInfo, allocation_callbacks, pDebugMessenger);
    } else {
        return VK_ERROR_EXTENSION_NOT_PRESENT;
    }
}